

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::setTexCubeArrayBinding
          (ReferenceContext *this,int unitNdx,TextureCubeArray *texture)

{
  reference pvVar1;
  TextureCubeArray *texture_local;
  int unitNdx_local;
  ReferenceContext *this_local;
  
  pvVar1 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)unitNdx);
  if (pvVar1->texCubeArrayBinding != (TextureCubeArray *)0x0) {
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&pvVar1->texCubeArrayBinding->super_Texture);
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    pvVar1->texCubeArrayBinding = (TextureCubeArray *)0x0;
  }
  if (texture != (TextureCubeArray *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::acquireReference
              (&this->m_textures,&texture->super_Texture);
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    pvVar1->texCubeArrayBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTexCubeArrayBinding (int unitNdx, TextureCubeArray* texture)
{
	if (m_textureUnits[unitNdx].texCubeArrayBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].texCubeArrayBinding);
		m_textureUnits[unitNdx].texCubeArrayBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].texCubeArrayBinding = texture;
	}
}